

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::writeAssociativeContainer<QHash<QFont::Tag,unsigned_int>>
          (QDataStream *s,QHash<QFont::Tag,_unsigned_int> *c)

{
  Span *pSVar1;
  bool bVar2;
  ulong uVar3;
  size_t value;
  long in_FS_OFFSET;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (c->d == (Data *)0x0) {
    value = 0;
  }
  else {
    value = c->d->size;
  }
  bVar2 = QDataStream::writeQSizeType(s,value);
  if (bVar2) {
    local_28 = (piter)QHash<QFont::Tag,_unsigned_int>::constBegin(c);
    while( true ) {
      if (local_28.d == (Data<QHashPrivate::Node<QFont::Tag,_unsigned_int>_> *)0x0 &&
          local_28.bucket == 0) break;
      pSVar1 = (local_28.d)->spans;
      uVar3 = local_28.bucket >> 7;
      QDataStream::operator<<
                (s,*(int *)pSVar1[uVar3].entries
                           [pSVar1[uVar3].offsets[(uint)local_28.bucket & 0x7f]].storage.data);
      QDataStream::operator<<
                (s,*(int *)((local_28.d)->spans[local_28.bucket >> 7].entries
                            [(local_28.d)->spans[local_28.bucket >> 7].offsets
                             [(uint)local_28.bucket & 0x7f]].storage.data + 4));
      QHashPrivate::iterator<QHashPrivate::Node<QFont::Tag,_unsigned_int>_>::operator++(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}